

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckyFast6.c
# Opt level: O1

word Extra_Truth6MinimumRoundOne_noEBFC(word t,int iVar,char *pCanonPerm,uint *pCanonPhase)

{
  char cVar1;
  uint uVar2;
  byte bVar3;
  word wVar4;
  
  if ((uint)iVar < 5) {
    wVar4 = Extra_Truth6SwapAdjacent(t,iVar);
    if (wVar4 <= t) {
      uVar2 = *pCanonPhase;
      bVar3 = (byte)iVar;
      cVar1 = pCanonPerm[(uint)iVar];
      pCanonPerm[(uint)iVar] = pCanonPerm[(ulong)(uint)iVar + 1];
      pCanonPerm[(ulong)(uint)iVar + 1] = cVar1;
      *pCanonPhase = 3 << (bVar3 & 0x1f) &
                     -((uVar2 >> (bVar3 + 1 & 0x1f) ^ uVar2 >> (bVar3 & 0x1f)) & 1) ^ uVar2;
      t = wVar4;
    }
    return t;
  }
  __assert_fail("iVar >= 0 && iVar < 5",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bool/lucky/luckyFast6.c"
                ,0xa1,"word Extra_Truth6MinimumRoundOne_noEBFC(word, int, char *, unsigned int *)");
}

Assistant:

word Extra_Truth6MinimumRoundOne_noEBFC( word t, int iVar,  char* pCanonPerm, unsigned* pCanonPhase)
{
    word tMin;     
    assert( iVar >= 0 && iVar < 5 );  
    
    tMin = Extra_Truth6SwapAdjacent( t, iVar );   // b a
    if(t<tMin)
        return t;
    else
    {
        (* pCanonPhase) = adjustInfoAfterSwap(pCanonPerm, * pCanonPhase, iVar, 4);
        return tMin;
    }
}